

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O0

void __thiscall duckdb::ART::WritePartialBlocks(ART *this,bool v1_0_0_storage)

{
  ulong uVar1;
  byte in_SIL;
  long in_RDI;
  idx_t i;
  idx_t allocator_count;
  PartialBlockManager partial_block_manager;
  BlockManager *block_manager;
  pointer in_stack_ffffffffffffff28;
  type in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff48;
  undefined1 uVar2;
  byte bVar3;
  undefined4 in_stack_ffffffffffffff4c;
  FixedSizeAllocator *in_stack_ffffffffffffff50;
  ulong local_a8;
  uint32_t in_stack_ffffffffffffff68;
  PartialBlockType in_stack_ffffffffffffff6c;
  BlockManager *in_stack_ffffffffffffff70;
  PartialBlockManager *in_stack_ffffffffffffff78;
  optional_idx in_stack_ffffffffffffff80;
  
  (**(code **)(**(long **)(in_RDI + 0x58) + 0x10))();
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff68);
  PartialBlockManager::PartialBlockManager
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff68);
  uVar2 = 9;
  bVar3 = 6;
  if ((in_SIL & 1) == 0) {
    bVar3 = 9;
  }
  uVar1 = (ulong)bVar3;
  for (local_a8 = 0; local_a8 < uVar1; local_a8 = local_a8 + 1) {
    in_stack_ffffffffffffff30 =
         shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
         ::operator*((shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                      *)in_stack_ffffffffffffff30);
    ::std::
    array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>
    ::operator[](in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff28 =
         unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>
         ::operator->(in_stack_ffffffffffffff30->_M_elems);
    FixedSizeAllocator::SerializeBuffers
              (in_stack_ffffffffffffff50,
               (PartialBlockManager *)
               CONCAT44(in_stack_ffffffffffffff4c,
                        CONCAT13(bVar3,CONCAT12(uVar2,in_stack_ffffffffffffff48))));
  }
  PartialBlockManager::FlushPartialBlocks((PartialBlockManager *)in_stack_ffffffffffffff50);
  PartialBlockManager::~PartialBlockManager((PartialBlockManager *)0x18db785);
  return;
}

Assistant:

void ART::WritePartialBlocks(const bool v1_0_0_storage) {
	auto &block_manager = table_io_manager.GetIndexBlockManager();
	PartialBlockManager partial_block_manager(block_manager, PartialBlockType::FULL_CHECKPOINT);

	idx_t allocator_count = v1_0_0_storage ? DEPRECATED_ALLOCATOR_COUNT : ALLOCATOR_COUNT;
	for (idx_t i = 0; i < allocator_count; i++) {
		(*allocators)[i]->SerializeBuffers(partial_block_manager);
	}
	partial_block_manager.FlushPartialBlocks();
}